

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_fds.c
# Opt level: O0

void NES_FDS_Reset(void *chip)

{
  int local_1c;
  int i;
  NES_FDS *fds;
  void *chip_local;
  
  *(undefined1 *)((long)chip + 0x2c) = 1;
  *(undefined1 *)((long)chip + 0x2d) = 0;
  *(undefined4 *)((long)chip + 0x30) = 0;
  *(undefined4 *)((long)chip + 0x34) = 0;
  *(undefined4 *)((long)chip + 0x274) = 0;
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    memset((void *)((long)chip + (long)local_1c * 0x100 + 0x38),0,0x100);
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x238) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x240) = 0;
  }
  *(undefined1 *)((long)chip + 0x248) = 0;
  *(undefined1 *)((long)chip + 0x249) = 1;
  *(undefined1 *)((long)chip + 0x24a) = 1;
  *(undefined1 *)((long)chip + 0x24b) = 1;
  *(undefined4 *)((long)chip + 0x24c) = 0;
  *(undefined4 *)((long)chip + 0x250) = 0;
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    *(undefined1 *)((long)chip + (long)local_1c + 0x254) = 0;
    *(undefined1 *)((long)chip + (long)local_1c + 0x256) = 1;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 600) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x260) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x268) = 0;
  }
  *(undefined4 *)((long)chip + 0x270) = 0xff;
  NES_FDS_Write(chip,0x4023,'\0');
  NES_FDS_Write(chip,0x4023,0x83);
  NES_FDS_Write(chip,0x4080,0x80);
  NES_FDS_Write(chip,0x408a,0xff);
  NES_FDS_Write(chip,0x4082,'\0');
  NES_FDS_Write(chip,0x4083,0x80);
  NES_FDS_Write(chip,0x4084,0x80);
  NES_FDS_Write(chip,0x4085,'\0');
  NES_FDS_Write(chip,0x4086,'\0');
  NES_FDS_Write(chip,0x4087,0x80);
  NES_FDS_Write(chip,0x4089,'\0');
  RC_RESET((RATIO_CNTR *)((long)chip + 0x280));
  return;
}

Assistant:

void NES_FDS_Reset(void* chip)
{
	NES_FDS* fds = (NES_FDS*)chip;
	int i;

	fds->master_io = true;
	fds->master_vol = 0;
	fds->last_freq = 0;
	fds->last_vol = 0;

	fds->rc_accum = 0;

	for (i=0; i<2; ++i)
	{
		memset(fds->wave[i], 0, sizeof(fds->wave[i]));
		fds->freq[i] = 0;
		fds->phase[i] = 0;
	}
	fds->wav_write = false;
	fds->wav_halt = true;
	fds->env_halt = true;
	fds->mod_halt = true;
	fds->mod_pos = 0;
	fds->mod_write_pos = 0;

	for (i=0; i<2; ++i)
	{
		fds->env_mode[i] = false;
		fds->env_disable[i] = true;
		fds->env_timer[i] = 0;
		fds->env_speed[i] = 0;
		fds->env_out[i] = 0;
	}
	fds->master_env_speed = 0xFF;

	// NOTE: the FDS BIOS reset only does the following related to audio:
	//   $4023 = $00
	//   $4023 = $83 enables master_io
	//   $4080 = $80 output volume = 0, envelope disabled
	//   $408A = $FF master envelope speed set to slowest
	NES_FDS_Write(fds, 0x4023, 0x00);
	NES_FDS_Write(fds, 0x4023, 0x83);
	NES_FDS_Write(fds, 0x4080, 0x80);
	NES_FDS_Write(fds, 0x408A, 0xFF);

	// reset other stuff
	NES_FDS_Write(fds, 0x4082, 0x00);	// wav freq 0
	NES_FDS_Write(fds, 0x4083, 0x80);	// wav disable
	NES_FDS_Write(fds, 0x4084, 0x80);	// mod strength 0
	NES_FDS_Write(fds, 0x4085, 0x00);	// mod position 0
	NES_FDS_Write(fds, 0x4086, 0x00);	// mod freq 0
	NES_FDS_Write(fds, 0x4087, 0x80);	// mod disable
	NES_FDS_Write(fds, 0x4089, 0x00);	// wav write disable, max global volume}

	RC_RESET(&fds->tick_count);
}